

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul>> *this)

{
  long *plVar1;
  char cVar2;
  undefined8 uVar3;
  
  if ((*(long **)(this + 0x30) != *(long **)(this + 0x20)) &&
     (cVar2 = (**(code **)(**(long **)(this + 0x30) + 0x30))(), cVar2 == '\0')) {
    return;
  }
  uVar3 = (**(code **)(**(long **)(this + 0x10) + 0x20))();
  plVar1 = *(long **)(this + 0x30);
  *(undefined8 *)(this + 0x30) = uVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  (**(code **)(**(long **)(this + 0x38) + 0x18))();
  if (*(long **)(this + 0x38) == *(long **)(this + 0x28)) {
    return;
  }
  (**(code **)(**(long **)(this + 0x38) + 0x30))();
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }